

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O2

string * __thiscall
jaegertracing::Span::operationName_abi_cxx11_(string *__return_storage_ptr__,Span *this)

{
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(this + 0x148))->__data);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(this + 200));
  pthread_mutex_unlock((pthread_mutex_t *)(this + 0x148));
  return __return_storage_ptr__;
}

Assistant:

std::string operationName() const
    {
        std::lock_guard<std::mutex> lock(_mutex);
        return _operationName;
    }